

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Wrap *ty)

{
  int iVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = *(int *)this;
  if (iVar1 == 2) {
    pcVar2 = "pinned";
  }
  else if (iVar1 == 1) {
    pcVar2 = "periodic";
  }
  else {
    if (iVar1 != 0) {
      return __return_storage_ptr__;
    }
    pcVar2 = "nonperiodic";
  }
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomBasisCurves::Wrap &ty) {
  std::string s;

  switch (ty) {
    case GeomBasisCurves::Wrap::Nonperiodic: {
      s = "nonperiodic";
      break;
    }
    case GeomBasisCurves::Wrap::Periodic: {
      s = "periodic";
      break;
    }
    case GeomBasisCurves::Wrap::Pinned: {
      s = "pinned";
      break;
    }
  }

  return s;
}